

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTable
          (BinaryReaderInterp *this,Index index,Type elem_type,Limits *elem_limits)

{
  undefined4 uVar1;
  Offset OVar2;
  char *pcVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  Result RVar6;
  Enum EVar7;
  Location loc;
  undefined3 uStack_58;
  undefined4 uStack_55;
  undefined1 uStack_51;
  bool local_4f;
  bool bStack_4e;
  undefined1 local_48 [27];
  undefined1 uStack_2d;
  undefined7 uStack_2c;
  undefined4 local_25;
  undefined1 local_21;
  bool local_20;
  bool local_1f;
  bool bStack_1e;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  pcVar3 = (this->filename_)._M_str;
  loc.filename._M_str._0_4_ = SUB84(pcVar3,0);
  loc.filename._M_str._4_4_ = (Enum)((ulong)pcVar3 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = (int)OVar2;
  loc.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  RVar6 = SharedValidator::OnTable(&this->validator_,&loc,elem_type,elem_limits);
  if (RVar6.enum_ == Error) {
    EVar7 = Error;
  }
  else {
    uVar4 = elem_limits->initial;
    uVar5 = elem_limits->max;
    loc.field_1.field_0.last_column = (int)uVar4;
    loc.field_1._12_4_ = (undefined4)(uVar4 >> 0x20);
    uStack_58 = (undefined3)uVar5;
    uStack_55 = (undefined4)(uVar5 >> 0x18);
    uStack_51 = (undefined1)(uVar5 >> 0x38);
    local_20 = elem_limits->has_max;
    loc.filename._M_str._0_4_ = 1;
    loc.filename._M_len = (size_t)&PTR__ExternType_001e6c00;
    loc.filename._M_str._4_4_ = elem_type.enum_;
    loc.field_1.field_0.line = elem_type.type_index_;
    uVar1._0_1_ = elem_limits->is_shared;
    uVar1._1_1_ = elem_limits->is_64;
    uVar1._2_2_ = *(undefined2 *)&elem_limits->field_0x13;
    _local_4f = (undefined2)uVar1;
    if ((local_20 & 1U) == 0) {
      uStack_58 = 0xffffff;
      uStack_55 = 0xff;
      uStack_51 = 0;
    }
    local_48._8_4_ = Table;
    local_48._0_8_ = &PTR__ExternType_001e6c00;
    local_48._20_7_ =
         (undefined7)CONCAT44(loc.field_1.field_0.last_column,loc.field_1.field_0.first_column);
    uStack_2d = (undefined1)(uVar4 >> 0x18);
    uStack_2c = (undefined7)(CONCAT35(uStack_58,(int5)(uVar4 >> 0x18)) >> 8);
    local_25 = uStack_55;
    local_21 = uStack_51;
    local_1f = local_4f;
    bStack_1e = bStack_4e;
    local_48._12_8_ = elem_type;
    std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::
    emplace_back<wabt::interp::TableDesc>(&this->module_->tables,(TableDesc *)local_48);
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,(value_type *)&loc);
    EVar7 = Ok;
  }
  return (Result)EVar7;
}

Assistant:

Result BinaryReaderInterp::OnTable(Index index,
                                   Type elem_type,
                                   const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(GetLocation(), elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.tables.push_back(TableDesc{table_type});
  table_types_.push_back(table_type);
  return Result::Ok;
}